

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

void __thiscall relive::ReLiveDB::deepFetch(ReLiveDB *this,Station *station,bool withoutStreams)

{
  is_equal_t<int_relive::Url::*,_int> r;
  is_equal_t<int_relive::Url::*,_int> r_00;
  is_equal_t<long_relive::Url::*,_long> l;
  is_equal_t<long_relive::Url::*,_long> l_00;
  is_equal_t<long_relive::Url::*,_long> l_01;
  and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  c;
  and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  c_00;
  and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  c_01;
  bool bVar1;
  reference pvVar2;
  expression_t<long_relive::Url::*> eVar3;
  expression_t<int_relive::Url::*> eVar4;
  left_type lVar5;
  expression_t<int_relive::Url::*> eVar6;
  byte in_DL;
  long in_RSI;
  is_equal_t<long_relive::Stream::*,_long> iVar7;
  is_equal_t<int_relive::Url::*,_int> iVar8;
  binary_condition<long_relive::Url::*,_long> bVar9;
  Url *api;
  iterator __end1;
  iterator __begin1;
  vector<relive::Url,_std::allocator<relive::Url>_> *__range1;
  vector<relive::Url,_std::allocator<relive::Url>_> apis;
  vector<relive::Url,_std::allocator<relive::Url>_> webSites;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffc18;
  offset_in_Url_to_long t;
  vector<relive::Url,_std::allocator<relive::Url>_> *__rhs;
  expression_t<int_relive::Url::*> in_stack_fffffffffffffc20;
  expression_t<int_relive::Url::*> eVar10;
  order_by_t<long_relive::Stream::*> *in_stack_fffffffffffffc28;
  vector<relive::Stream,_std::allocator<relive::Stream>_> *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  undefined8 uVar11;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  left_type in_stack_fffffffffffffc48;
  right_type in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc80;
  undefined8 in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>
  *in_stack_fffffffffffffd00;
  expression_t<long_relive::Stream::*> in_stack_fffffffffffffd08;
  order_by_t<long_relive::Stream::*> *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  storage_t<_86c824a_> *in_stack_fffffffffffffd28;
  vector<relive::Url,_std::allocator<relive::Url>_> *local_298;
  vector<relive::Url,_std::allocator<relive::Url>_> *pvStack_290;
  vector<relive::Url,_std::allocator<relive::Url>_> local_258;
  reference local_240;
  Url *local_238;
  __normal_iterator<relive::Url_*,_std::vector<relive::Url,_std::allocator<relive::Url>_>_>
  local_230;
  vector<relive::Url,_std::allocator<relive::Url>_> *local_228;
  left_type local_220;
  right_type_conflict local_218;
  offset_in_Url_to_int local_210;
  left_type local_208;
  right_type_conflict local_200;
  offset_in_Url_to_long local_1f8;
  binary_condition<long_relive::Url::*,_long> local_1f0;
  vector<relive::Url,_std::allocator<relive::Url>_> *local_1e0;
  __normal_iterator<relive::Url_*,_std::vector<relive::Url,_std::allocator<relive::Url>_>_>
  *p_Stack_1d8;
  undefined8 local_1c0;
  vector<relive::Url,_std::allocator<relive::Url>_> local_190;
  left_type local_178;
  right_type_conflict local_170;
  offset_in_Url_to_int local_168;
  left_type local_160;
  right_type_conflict local_158;
  offset_in_Url_to_long local_150;
  binary_condition<long_relive::Url::*,_long> local_148;
  offset_in_Url_to_long local_138;
  vector<relive::Url,_std::allocator<relive::Url>_> *pvStack_130;
  vector<relive::Url,_std::allocator<relive::Url>_> *pvStack_120;
  undefined8 local_118;
  vector<relive::Url,_std::allocator<relive::Url>_> local_e8 [5];
  offset_in_Stream_to_long local_70;
  where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>
  *local_68;
  right_type local_60;
  binary_condition<long_relive::Stream::*,_long> local_58;
  vector<relive::Stream,_std::allocator<relive::Stream>_> local_38;
  byte local_11;
  long local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffc20.t,
             in_stack_fffffffffffffc18);
  if ((local_11 & 1) == 0) {
    storage_abi_cxx11_();
    in_stack_fffffffffffffd08 =
         sqlite_orm::c<long_relive::Stream::*>((offset_in_Stream_to_long)in_stack_fffffffffffffc18);
    local_70 = in_stack_fffffffffffffd08.t;
    iVar7 = sqlite_orm::operator==
                      ((expression_t<long_relive::Stream::*>)in_stack_fffffffffffffc20.t,
                       (long)in_stack_fffffffffffffc18);
    local_60 = iVar7.super_binary_condition<long_relive::Stream::*,_long>.r;
    in_stack_fffffffffffffd00 =
         (where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>
          *)iVar7.super_binary_condition<long_relive::Stream::*,_long>.l;
    iVar7.super_binary_condition<long_relive::Stream::*,_long>.r =
         (right_type)in_stack_fffffffffffffc30;
    iVar7.super_binary_condition<long_relive::Stream::*,_long>.l =
         (left_type)in_stack_fffffffffffffc28;
    local_68 = in_stack_fffffffffffffd00;
    local_58 = (binary_condition<long_relive::Stream::*,_long>)
               sqlite_orm::where<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,long>>
                         (iVar7);
    sqlite_orm::order_by<long_relive::Stream::*>
              ((offset_in_Stream_to_long)in_stack_fffffffffffffc18);
    sqlite_orm::internal::order_by_t<long_relive::Stream::*>::desc(in_stack_fffffffffffffc28);
    sqlite_orm::internal::storage_t<$86c824a$>::
    get_all<relive::Stream,_sqlite_orm::internal::where_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long>_>,_sqlite_orm::internal::order_by_t<long_relive::Stream::*>_>
              (in_stack_fffffffffffffd28,
               (where_t<sqlite_orm::internal::is_equal_t<long_relive::Stream::*,_long>_> *)
               CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18);
    std::vector<relive::Stream,_std::allocator<relive::Stream>_>::operator=
              (in_stack_fffffffffffffc30,
               (vector<relive::Stream,_std::allocator<relive::Stream>_> *)in_stack_fffffffffffffc28)
    ;
    std::vector<relive::Stream,_std::allocator<relive::Stream>_>::~vector(&local_38);
    sqlite_orm::internal::order_by_t<long_relive::Stream::*>::~order_by_t
              ((order_by_t<long_relive::Stream::*> *)0x167ec8);
    sqlite_orm::internal::order_by_t<long_relive::Stream::*>::~order_by_t
              ((order_by_t<long_relive::Stream::*> *)0x167ed5);
  }
  storage_abi_cxx11_();
  local_150 = (offset_in_Url_to_long)
              sqlite_orm::c<long_relive::Url::*>((offset_in_Url_to_long)in_stack_fffffffffffffc18);
  local_148 = (binary_condition<long_relive::Url::*,_long>)
              sqlite_orm::operator==
                        ((expression_t<long_relive::Url::*>)in_stack_fffffffffffffc20.t,
                         (long)in_stack_fffffffffffffc18);
  local_168 = (offset_in_Url_to_int)
              sqlite_orm::c<int_relive::Url::*>((offset_in_Url_to_int)in_stack_fffffffffffffc18);
  iVar8 = sqlite_orm::operator==
                    (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
  local_178 = iVar8.super_binary_condition<int_relive::Url::*,_int>.l;
  local_170 = iVar8.super_binary_condition<int_relive::Url::*,_int>.r;
  l.super_binary_condition<long_relive::Url::*,_long>.r = in_stack_fffffffffffffc50;
  l.super_binary_condition<long_relive::Url::*,_long>.l = in_stack_fffffffffffffc48;
  iVar8.super_binary_condition<int_relive::Url::*,_int>.r = in_stack_fffffffffffffc40;
  iVar8.super_binary_condition<int_relive::Url::*,_int>.l = in_stack_fffffffffffffc38;
  iVar8.super_binary_condition<int_relive::Url::*,_int>._12_4_ = in_stack_fffffffffffffc44;
  local_160 = local_178;
  local_158 = local_170;
  sqlite_orm::operator&&(l,iVar8);
  c.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .l.super_binary_condition<long_relive::Url::*,_long>.l = in_stack_fffffffffffffc88;
  c.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  ._0_8_ = in_stack_fffffffffffffc80;
  c.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .l.super_binary_condition<long_relive::Url::*,_long>.r = in_stack_fffffffffffffc90;
  c.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .r.super_binary_condition<int_relive::Url::*,_int>.l = in_stack_fffffffffffffc98;
  c.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .r.super_binary_condition<int_relive::Url::*,_int>._8_8_ = in_stack_fffffffffffffca0;
  sqlite_orm::
  where<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,long>,sqlite_orm::internal::is_equal_t<int_relive::Url::*,int>>>
            (c);
  sqlite_orm::internal::storage_t<$86c824a$>::
  get_all<relive::Url,_sqlite_orm::internal::where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>_>
            ((storage_t<_86c824a_> *)in_stack_fffffffffffffd08.t,in_stack_fffffffffffffd00);
  bVar1 = std::vector<relive::Url,_std::allocator<relive::Url>_>::empty(pvStack_120);
  t = local_138;
  eVar10.t = (offset_in_Url_to_int)pvStack_130;
  uVar11 = local_118;
  if (!bVar1) {
    pvVar2 = std::vector<relive::Url,_std::allocator<relive::Url>_>::front(pvStack_130);
    std::__cxx11::string::operator=((string *)(local_10 + 0x68),(string *)&pvVar2->_url);
    t = local_138;
    eVar10.t = (offset_in_Url_to_int)pvStack_130;
    uVar11 = local_118;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x168123);
  storage_abi_cxx11_();
  eVar3 = sqlite_orm::c<long_relive::Url::*>(t);
  local_1f8 = eVar3.t;
  bVar9 = (binary_condition<long_relive::Url::*,_long>)
          sqlite_orm::operator==((expression_t<long_relive::Url::*>)eVar10.t,t);
  local_1f0 = bVar9;
  eVar4 = sqlite_orm::c<int_relive::Url::*>(t);
  local_210 = eVar4.t;
  iVar8 = sqlite_orm::operator==(eVar10,(int)(t >> 0x20));
  lVar5 = iVar8.super_binary_condition<int_relive::Url::*,_int>.l;
  local_218 = iVar8.super_binary_condition<int_relive::Url::*,_int>.r;
  l_00.super_binary_condition<long_relive::Url::*,_long>.r = in_stack_fffffffffffffc50;
  l_00.super_binary_condition<long_relive::Url::*,_long>.l = in_stack_fffffffffffffc48;
  r.super_binary_condition<int_relive::Url::*,_int>.r = in_stack_fffffffffffffc40;
  r.super_binary_condition<int_relive::Url::*,_int>.l = uVar11;
  r.super_binary_condition<int_relive::Url::*,_int>._12_4_ = in_stack_fffffffffffffc44;
  local_220 = lVar5;
  local_208 = lVar5;
  local_200 = local_218;
  sqlite_orm::operator&&(l_00,r);
  c_00.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .l.super_binary_condition<long_relive::Url::*,_long>.l = eVar4.t;
  c_00.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  ._0_8_ = lVar5;
  c_00.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .l.super_binary_condition<long_relive::Url::*,_long>.r = bVar9.r;
  c_00.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .r.super_binary_condition<int_relive::Url::*,_int>.l = bVar9.l;
  c_00.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .r.super_binary_condition<int_relive::Url::*,_int>._8_8_ = eVar3.t;
  sqlite_orm::
  where<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,long>,sqlite_orm::internal::is_equal_t<int_relive::Url::*,int>>>
            (c_00);
  sqlite_orm::internal::storage_t<$86c824a$>::
  get_all<relive::Url,_sqlite_orm::internal::where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>_>
            ((storage_t<_86c824a_> *)in_stack_fffffffffffffd08.t,in_stack_fffffffffffffd00);
  local_228 = &local_190;
  local_230._M_current =
       (Url *)std::vector<relive::Url,_std::allocator<relive::Url>_>::begin(local_1e0);
  local_238 = (Url *)std::vector<relive::Url,_std::allocator<relive::Url>_>::end(local_1e0);
  __rhs = local_1e0;
  eVar10.t = (offset_in_Url_to_int)p_Stack_1d8;
  uVar11 = local_1c0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<relive::Url_*,_std::vector<relive::Url,_std::allocator<relive::Url>_>_>
                        *)eVar10.t,
                       (__normal_iterator<relive::Url_*,_std::vector<relive::Url,_std::allocator<relive::Url>_>_>
                        *)__rhs);
    if (!bVar1) break;
    local_240 = __gnu_cxx::
                __normal_iterator<relive::Url_*,_std::vector<relive::Url,_std::allocator<relive::Url>_>_>
                ::operator*(&local_230);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_10 + 0x88),&local_240->_url);
    __gnu_cxx::
    __normal_iterator<relive::Url_*,_std::vector<relive::Url,_std::allocator<relive::Url>_>_>::
    operator++(&local_230);
  }
  storage_abi_cxx11_();
  sqlite_orm::c<long_relive::Url::*>((offset_in_Url_to_long)__rhs);
  sqlite_orm::operator==((expression_t<long_relive::Url::*>)eVar10.t,(long)__rhs);
  eVar6 = sqlite_orm::c<int_relive::Url::*>((offset_in_Url_to_int)__rhs);
  iVar8 = sqlite_orm::operator==(eVar10,(int)((ulong)__rhs >> 0x20));
  l_01.super_binary_condition<long_relive::Url::*,_long>.r = eVar6.t;
  l_01.super_binary_condition<long_relive::Url::*,_long>.l =
       iVar8.super_binary_condition<int_relive::Url::*,_int>.l;
  r_00.super_binary_condition<int_relive::Url::*,_int>.r = in_stack_fffffffffffffc40;
  r_00.super_binary_condition<int_relive::Url::*,_int>.l = uVar11;
  r_00.super_binary_condition<int_relive::Url::*,_int>._12_4_ =
       iVar8.super_binary_condition<int_relive::Url::*,_int>.r;
  sqlite_orm::operator&&(l_01,r_00);
  c_01.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .l.super_binary_condition<long_relive::Url::*,_long>.l = eVar4.t;
  c_01.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  ._0_8_ = lVar5;
  c_01.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .l.super_binary_condition<long_relive::Url::*,_long>.r = bVar9.r;
  c_01.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .r.super_binary_condition<int_relive::Url::*,_int>.l = bVar9.l;
  c_01.
  super_binary_condition<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>
  .r.super_binary_condition<int_relive::Url::*,_int>._8_8_ = eVar3.t;
  sqlite_orm::
  where<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,long>,sqlite_orm::internal::is_equal_t<int_relive::Url::*,int>>>
            (c_01);
  sqlite_orm::internal::storage_t<$86c824a$>::
  get_all<relive::Url,_sqlite_orm::internal::where_t<sqlite_orm::internal::and_condition_t<sqlite_orm::internal::is_equal_t<long_relive::Url::*,_long>,_sqlite_orm::internal::is_equal_t<int_relive::Url::*,_int>_>_>_>
            ((storage_t<_86c824a_> *)in_stack_fffffffffffffd08.t,in_stack_fffffffffffffd00);
  std::vector<relive::Url,_std::allocator<relive::Url>_>::operator=(pvStack_290,local_298);
  std::vector<relive::Url,_std::allocator<relive::Url>_>::~vector(&local_258);
  std::vector<relive::Url,_std::allocator<relive::Url>_>::~vector(&local_190);
  std::vector<relive::Url,_std::allocator<relive::Url>_>::~vector(local_e8);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1684f7);
  return;
}

Assistant:

void ReLiveDB::deepFetch(Station& station, bool withoutStreams)
{
    std::lock_guard<Mutex> lock{_mutex};
    if (!withoutStreams) {
        station._streams = storage().get_all<Stream>(where(c(&Stream::_stationId) == station._id), order_by(&Stream::_timestamp).desc());
    }
    auto webSites = storage().get_all<Url>(where(c(&Url::_ownerId) == station._id and c(&Url::_type) == int(Url::eWeb)));
    if (!webSites.empty()) {
        station._webSiteUrl = webSites.front()._url;
    }
    station._api.clear();
    auto apis = storage().get_all<Url>(where(c(&Url::_ownerId) == station._id and c(&Url::_type) == int(Url::eStationAPI)));
    for (const auto& api : apis) {
        station._api.push_back(api._url);
    }
    station._liveStream = storage().get_all<Url>(where(c(&Url::_ownerId) == station._id and c(&Url::_type) == int(Url::eLiveStream)));
}